

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriesestimator.cxx
# Opt level: O2

Matrix * __thiscall
SeriesEstimator::getDistribution(Matrix *__return_storage_ptr__,SeriesEstimator *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  longdouble lVar4;
  int iVar5;
  uint uVar6;
  int i;
  ulong uVar7;
  int i_00;
  ulong uVar8;
  ulong uVar9;
  longdouble lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  Matrix local_330;
  Matrix local_230;
  Matrix local_130;
  
  uVar6 = (this->super_Estimator).nSamples;
  lVar10 = (longdouble)uVar6;
  if (uVar6 == 0) {
    lVar10 = (longdouble)1;
  }
  uVar6 = this->estimatorPost + this->estimatorPre;
  Matrix::Matrix(__return_storage_ptr__,uVar6,this->estimatorDistLength,3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"conditional density",(allocator<char> *)&local_230);
  Matrix::setName(__return_storage_ptr__,(string *)&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (this->seriesSource != (StochasticEventGenerator *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_370,
               (string *)
               &(this->seriesSource->super_StochasticVariable).super_StochasticProcess.
                super_Parametric.parametricName);
    std::operator+(&local_350,"density of ",&local_370);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_350," (");
    std::__cxx11::string::string
              ((string *)&local_390,
               (string *)
               &(this->seriesSource->super_StochasticVariable).super_StochasticProcess.
                super_Parametric.parametricType);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_390);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_330,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   ")");
    Matrix::setName(__return_storage_ptr__,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
  }
  if (((this->super_Estimator).nEstimate & 2) != 0) {
    uVar8 = 0;
    uVar9 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar9 = uVar8;
    }
    for (; (long)uVar8 < (long)this->estimatorDistLength; uVar8 = uVar8 + 1) {
      i_00 = (int)uVar8;
      for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        i = (int)uVar7;
        iVar5 = this->estimatorPre;
        Matrix::operator[](&local_130,__return_storage_ptr__,i);
        Matrix::operator[](&local_230,&local_130,i_00);
        Matrix::operator[](&local_330,&local_230,0);
        Matrix::operator=(&local_330,(double)(i - iVar5));
        Matrix::~Matrix(&local_330);
        Matrix::~Matrix(&local_230);
        Matrix::~Matrix(&local_130);
        dVar1 = this->estimatorDistScale;
        dVar2 = this->estimatorDistOffset;
        dVar3 = ((this->super_Estimator).estimatorTime)->dt;
        Matrix::operator[](&local_130,__return_storage_ptr__,i);
        Matrix::operator[](&local_230,&local_130,i_00);
        Matrix::operator[](&local_330,&local_230,1);
        Matrix::operator=(&local_330,(dVar1 * (double)i_00 + dVar2) * dVar3);
        Matrix::~Matrix(&local_330);
        Matrix::~Matrix(&local_230);
        Matrix::~Matrix(&local_130);
        lVar4 = this->estimatorDist[uVar7][uVar8];
        Matrix::operator[](&local_130,__return_storage_ptr__,i);
        Matrix::operator[](&local_230,&local_130,i_00);
        Matrix::operator[](&local_330,&local_230,2);
        Matrix::operator=(&local_330,(double)(lVar4 / lVar10));
        Matrix::~Matrix(&local_330);
        Matrix::~Matrix(&local_230);
        Matrix::~Matrix(&local_130);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix SeriesEstimator::getDistribution()
{
	double samples = (nSamples!=0.0)? double(nSamples): 1.0;
	
	int timeSize = estimatorPre+estimatorPost;
	Matrix a(timeSize, estimatorDistLength, 3);
	a.setName("conditional density");
	if (seriesSource)
		a.setName("density of " + seriesSource->getName() + " (" + seriesSource->getType() + ")" );
	
	if ( nEstimate & EST_DENS ) {
		for ( int j=0; j<estimatorDistLength; j++)
			for ( int i=0; i<timeSize; i++ ) {
				a[i][j][0] = i - estimatorPre;
				a[i][j][1] = estimatorTime->dt * ((double(j) * estimatorDistScale) + estimatorDistOffset);
				a[i][j][2] = estimatorDist[i][j] / samples;
			}
	}
	return a;
}